

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

void Sim_UtilInfoDetectNews(uint *pInfo1,uint *pInfo2,int nWords,Vec_Int_t *vDiffs)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  vDiffs->nSize = 0;
  uVar5 = 0;
  uVar6 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar6 = uVar5;
  }
  for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
    uVar1 = pInfo1[uVar3];
    uVar2 = pInfo2[uVar3];
    if ((~uVar1 & uVar2) != 0) {
      for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 1) {
        if (((~uVar1 & uVar2) >> (uVar4 & 0x1f) & 1) != 0) {
          Vec_IntPush(vDiffs,uVar4 + (int)uVar5);
        }
      }
    }
    uVar5 = (ulong)((int)uVar5 + 0x20);
  }
  return;
}

Assistant:

void Sim_UtilInfoDetectNews( unsigned * pInfo1, unsigned * pInfo2, int nWords, Vec_Int_t * vDiffs )
{
    int w, b;
    unsigned uMask;
    vDiffs->nSize = 0;
    for ( w = 0; w < nWords; w++ )
        if ( (uMask = (pInfo2[w] & ~pInfo1[w])) )
            for ( b = 0; b < 32; b++ )
                if ( uMask & (1 << b) )
                    Vec_IntPush( vDiffs, 32*w + b );
}